

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryEntry.h
# Opt level: O2

bool __thiscall
JsUtil::
CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,JsUtil::(anonymous_namespace)::KeyValueEntry>
::KeyEquals<Js::PropertyRecordStringHashComparer<Js::JavascriptString*>,Js::JavascriptString*>
          (CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,JsUtil::(anonymous_namespace)::KeyValueEntry>
           *this,JavascriptString **otherKey,hash_t otherHashCode)

{
  code *pcVar1;
  bool bVar2;
  hash_t hVar3;
  undefined4 *puVar4;
  
  hVar3 = Js::PropertyRecordStringHashComparer<Js::JavascriptString_*>::GetHashCode
                    (*(JavascriptString **)(this + 8));
  hVar3 = hVar3 * 2 + 1;
  if (hVar3 != *(hash_t *)(this + 0x10)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                       ,199,
                       "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                       ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    hVar3 = *(hash_t *)(this + 0x10);
  }
  if (hVar3 == otherHashCode) {
    bVar2 = Js::PropertyRecordStringHashComparer<Js::JavascriptString_*>::Equals
                      (*(JavascriptString **)(this + 8),*otherKey);
    return bVar2;
  }
  return false;
}

Assistant:

inline bool KeyEquals(TLookup const& otherKey, hash_t otherHashCode)
        {
            Assert(TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode);
            return this->hashCode == otherHashCode && Comparer::Equals(this->Key(), otherKey);
        }